

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

void __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::HashMap(HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
          *this,size_type capacity)

{
  unique_ptr<BCL::Team,_std::default_delete<BCL::Team>_> *puVar1;
  vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  *this_00;
  pointer pGVar2;
  int iVar3;
  Team *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *pHVar5;
  undefined4 extraout_var_02;
  runtime_error *this_01;
  size_type i;
  ulong uVar6;
  long lVar7;
  size_type rank;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  GVar8;
  value_type local_38;
  
  this->capacity_ = capacity;
  puVar1 = &this->team_ptr_;
  pTVar4 = (Team *)operator_new(8);
  pTVar4->_vptr_Team = (_func_int **)&PTR_resolve_0010e758;
  (this->team_ptr_)._M_t.super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
  super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
  super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl = pTVar4;
  this_00 = &this->hash_table_;
  (this->hash_table_).
  super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hash_table_).
  super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hash_table_).
  super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = my_nprocs;
  this->local_capacity_ = ((capacity + my_nprocs) - 1) / my_nprocs;
  local_38.rank = 0;
  local_38.ptr = 0;
  std::
  vector<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ::resize(this_00,uVar6,&local_38);
  GVar8 = local_malloc<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
                    (this->local_capacity_);
  pTVar4 = (puVar1->_M_t).super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
           super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
           super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl;
  iVar3 = (**pTVar4->_vptr_Team)(pTVar4,my_rank);
  pGVar2 = (this_00->
           super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pGVar2[CONCAT44(extraout_var,iVar3)].rank = GVar8.rank;
  pGVar2[CONCAT44(extraout_var,iVar3)].ptr = GVar8.ptr;
  pTVar4 = (puVar1->_M_t).super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
           super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
           super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl;
  iVar3 = (**pTVar4->_vptr_Team)(pTVar4,my_rank);
  pGVar2 = (this_00->
           super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pGVar2[CONCAT44(extraout_var_00,iVar3)].ptr != 0 ||
      pGVar2[CONCAT44(extraout_var_00,iVar3)].rank != 0) {
    pTVar4 = (puVar1->_M_t).super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>._M_t.
             super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
             super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl;
    iVar3 = (**pTVar4->_vptr_Team)(pTVar4,my_rank);
    pHVar5 = GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
             ::local((this_00->
                     super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + CONCAT44(extraout_var_01,iVar3));
    for (uVar6 = 0; uVar6 < this->local_capacity_; uVar6 = uVar6 + 1) {
      (pHVar5->key).len = 0;
      pHVar5->val = 0;
      pHVar5->used = 0;
      (pHVar5->key).ptr.rank = 0;
      (pHVar5->key).ptr.ptr = 0;
      pHVar5 = pHVar5 + 1;
    }
    lVar7 = 0;
    uVar6 = 0;
    while( true ) {
      iVar3 = (*((puVar1->_M_t).super___uniq_ptr_impl<BCL::Team,_std::default_delete<BCL::Team>_>.
                 _M_t.super__Tuple_impl<0UL,_BCL::Team_*,_std::default_delete<BCL::Team>_>.
                 super__Head_base<0UL,_BCL::Team_*,_false>._M_head_impl)->_vptr_Team[1])();
      if (CONCAT44(extraout_var_02,iVar3) <= uVar6) break;
      GVar8 = broadcast<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>>
                        ((GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                          *)((long)&((this_00->
                                     super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->rank + lVar7),
                         uVar6);
      pGVar2 = (this_00->
               super__Vector_base<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>,_std::allocator<BCL::GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(size_t *)((long)&pGVar2->rank + lVar7) = GVar8.rank;
      *(size_t *)((long)&pGVar2->ptr + lVar7) = GVar8.ptr;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    }
    barrier();
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"BCL::HashMap: ran out of memory\n");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

HashMap(size_type capacity) : capacity_(capacity), team_ptr_(new BCL::WorldTeam()) {
    local_capacity_ = (capacity_ + BCL::nprocs(team()) - 1) / BCL::nprocs(team());
    hash_table_.resize(BCL::nprocs(team()), nullptr);

    hash_table_[BCL::rank(team())] = BCL::alloc <HME> (local_capacity_);

    if (hash_table_[BCL::rank(team())] == nullptr) {
      throw std::runtime_error("BCL::HashMap: ran out of memory\n");
    }

    HME* local_table = hash_table_[BCL::rank(team())].local();
    for (size_type i = 0; i < local_capacity_; i++) {
        new (&local_table[i]) HME();
    }

    for (size_type rank = 0; rank < BCL::nprocs(team()); rank++) {
      hash_table_[rank] = BCL::broadcast(hash_table_[rank], rank);
    }
    BCL::barrier();
  }